

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O1

void error(QPDF *qpdf,QPDFObjectHandle *node,string *msg)

{
  QPDFExc *this;
  string sStack_68;
  string local_48;
  
  this = (QPDFExc *)__cxa_allocate_exception(0x80);
  QPDF::getFilename_abi_cxx11_(&local_48,qpdf);
  get_description_abi_cxx11_(&sStack_68,node);
  QPDFExc::QPDFExc(this,qpdf_e_damaged_pdf,&local_48,&sStack_68,0,msg);
  __cxa_throw(this,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

static void
error(QPDF& qpdf, QPDFObjectHandle& node, std::string const& msg)
{
    throw QPDFExc(qpdf_e_damaged_pdf, qpdf.getFilename(), get_description(node), 0, msg);
}